

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableType.cpp
# Opt level: O2

bool __thiscall rsg::VariableType::operator!=(VariableType *this,VariableType *other)

{
  VariableType *this_00;
  bool bVar1;
  
  if (((this->m_baseType == other->m_baseType) && (this->m_precision == other->m_precision)) &&
     (this->m_numElements == other->m_numElements)) {
    this_00 = this->m_elementType;
    if ((this_00 != (VariableType *)0x0) != (other->m_elementType == (VariableType *)0x0)) {
      if ((this_00 != (VariableType *)0x0) &&
         (bVar1 = operator!=(this_00,other->m_elementType), bVar1)) {
        return true;
      }
      bVar1 = std::operator!=(&this->m_members,&other->m_members);
      return bVar1;
    }
  }
  return true;
}

Assistant:

bool VariableType::operator!= (const VariableType& other) const
{
	if (m_baseType != other.m_baseType)
		return true;
	if (m_precision != other.m_precision)
		return true;
	if (m_numElements != other.m_numElements)
		return true;
	if (!!m_elementType != !!other.m_elementType)
		return true;
	if (m_elementType && *m_elementType != *other.m_elementType)
		return true;
	if (m_members != other.m_members)
		return true;
	return false;
}